

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void __thiscall
Assimp::SceneCombiner::AddNodeHashes
          (SceneCombiner *this,aiNode *node,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *extraout_RDX;
  uint i;
  ulong uVar1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar2;
  uint32_t local_1c;
  
  if (*(uint32_t *)this != 0) {
    local_1c = SuperFastHash((char *)(this + 4),*(uint32_t *)this,0);
    pVar2 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>
                      ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)node,&local_1c);
    hashes = pVar2._8_8_;
  }
  for (uVar1 = 0; uVar1 < *(uint *)(this + 0x450); uVar1 = uVar1 + 1) {
    AddNodeHashes(*(SceneCombiner **)(*(long *)(this + 0x458) + uVar1 * 8),node,hashes);
    hashes = extraout_RDX;
  }
  return;
}

Assistant:

void SceneCombiner::AddNodeHashes(aiNode* node, std::set<unsigned int>& hashes) {
    // Add node name to hashing set if it is non-empty - empty nodes are allowed
    // and they can't have any anims assigned so its absolutely safe to duplicate them.
    if (node->mName.length) {
        hashes.insert( SuperFastHash(node->mName.data, static_cast<uint32_t>(node->mName.length)) );
    }

    // Process all children recursively
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        AddNodeHashes(node->mChildren[i],hashes);
}